

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_hash.cpp
# Opt level: O0

int __thiscall
sc_core::sc_phash_base::remove_by_contents(sc_phash_base *this,void *c,_func_void_void_ptr *kfree)

{
  code *in_RDX;
  void *in_RSI;
  long in_RDI;
  int i;
  int num_removed;
  sc_phash_elem *ptr;
  sc_phash_elem **last;
  size_t in_stack_ffffffffffffffa8;
  int local_30;
  int local_2c;
  sc_phash_elem *local_28;
  sc_phash_elem **local_20;
  
  local_2c = 0;
  for (local_30 = 0; local_30 < *(int *)(in_RDI + 8); local_30 = local_30 + 1) {
    local_20 = (sc_phash_elem **)(*(long *)(in_RDI + 0x20) + (long)local_30 * 8);
    local_28 = *local_20;
    while (local_28 != (sc_phash_elem *)0x0) {
      if (local_28->contents == in_RSI) {
        *local_20 = local_28->next;
        (*in_RDX)(local_28->key);
        if (local_28 != (sc_phash_elem *)0x0) {
          sc_phash_elem::~sc_phash_elem(local_28);
          sc_phash_elem::operator_delete(local_28,in_stack_ffffffffffffffa8);
        }
        local_28 = *local_20;
        *(int *)(in_RDI + 0xc) = *(int *)(in_RDI + 0xc) + -1;
        local_2c = local_2c + 1;
      }
      else {
        local_20 = &local_28->next;
        local_28 = *local_20;
      }
    }
  }
  return local_2c;
}

Assistant:

int
sc_phash_base::remove_by_contents( const void* c, void (*kfree)(void*) )
{
    sc_phash_elem** last;
    sc_phash_elem*  ptr;

    int num_removed = 0;
    for (int i = 0; i < num_bins; ++i) {
        last = &(bins[i]);
        ptr = *last;
        while (ptr != 0) {
            if (ptr->contents != c) {
                last = &(ptr->next);
                ptr  = *last;
            }
            else {
                *last = ptr->next;
                (*kfree)(ptr->key);
                delete ptr;
                ptr = *last;
                --num_entries;
                ++num_removed;
            }
        }
    }
    return num_removed;
}